

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_subgraph.cpp
# Opt level: O2

void __thiscall
Disa::Adjacency_Subgraph::Adjacency_Subgraph
          (Adjacency_Subgraph *this,Adjacency_Graph<false> *parent_graph,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *i_partition_local_global,
          size_t extra_levels)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  pointer puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Adjacency_Graph<false> *pAVar4;
  bool bVar5;
  size_t sVar6;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var7;
  unsigned_long *puVar8;
  ostream *poVar9;
  uint uVar10;
  source_location *psVar11;
  ulong uVar12;
  source_location *psVar13;
  ulong *puVar14;
  long lVar15;
  const_iterator __first;
  pointer puVar16;
  difference_type __n;
  size_type __n_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __it;
  source_location *psVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  ulong uVar18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var19;
  ulong *puVar20;
  uint uVar21;
  unsigned_long *i_global_vertex;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var22;
  unsigned_long *puVar23;
  const_iterator __first_00;
  uint uVar24;
  long lVar25;
  unsigned_long uVar26;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __it_00;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  pVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  Adjacency_Graph<false> *local_1d0;
  Adjacency_Graph<false> *local_1c8;
  size_t i_vertex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  vector<bool,_std::allocator<bool>_> adjacency_delete;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_148;
  ulong local_140;
  undefined1 local_138 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  vector<unsigned_long,_std::allocator<unsigned_long>_> unique_check;
  vector<unsigned_long,_std::allocator<unsigned_long>_> i_global_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> new_indexes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined **local_38;
  
  adjacency_delete.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  adjacency_delete.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  adjacency_delete.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  adjacency_delete.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._12_4_ = 0;
  adjacency_delete.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  adjacency_delete.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  adjacency_delete.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._12_4_ = 0;
  psVar11 = (source_location *)extra_levels;
  sVar6 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                    ((hash<Disa::Adjacency_Graph<false>_> *)&local_1f0,
                     (Adjacency_Graph<false> *)&adjacency_delete);
  Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)&adjacency_delete);
  this->hash_parent = sVar6;
  local_1d0 = &this->graph;
  (this->graph).vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->graph).vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->graph).vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->i_local_global).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->i_local_global).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->i_local_global).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->level_set_value).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->level_set_value).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->level_set_value).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unique_check.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unique_check.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  unique_check.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  unique_copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(i_partition_local_global->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(i_partition_local_global->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish,&unique_check);
  lVar15 = (long)unique_check.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)unique_check.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  __it_00._M_current =
       (i_partition_local_global->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
       ._M_impl.super__Vector_impl_data._M_start;
  puVar23 = (i_partition_local_global->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar25 = (long)puVar23 - (long)__it_00._M_current;
  local_1c8 = parent_graph;
  if (lVar15 == lVar25) {
    psVar11 = (source_location *)
              (parent_graph->offset).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    psVar13 = (source_location *)
              (parent_graph->offset).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar12 = 0;
    if (psVar11 != psVar13) {
      uVar12 = ((long)psVar11 - (long)psVar13 >> 3) - 1;
    }
    if ((ulong)(lVar15 >> 3) <= uVar12) {
      adjacency_delete.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)parent_graph;
      for (lVar15 = lVar15 >> 5; _Var22._M_current = __it_00._M_current, 0 < lVar15;
          lVar15 = lVar15 + -1) {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_0>
                ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_graph_adjacency_subgraph_cpp:49:3)>
                              *)&adjacency_delete,__it_00);
        if (bVar5) goto LAB_00122fb3;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_0>
                ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_graph_adjacency_subgraph_cpp:49:3)>
                              *)&adjacency_delete,
                             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(__it_00._M_current + 1));
        _Var22._M_current = __it_00._M_current + 1;
        if (bVar5) goto LAB_00122fb3;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_0>
                ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_graph_adjacency_subgraph_cpp:49:3)>
                              *)&adjacency_delete,
                             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(__it_00._M_current + 2));
        _Var22._M_current = __it_00._M_current + 2;
        if (bVar5) goto LAB_00122fb3;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_0>
                ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_graph_adjacency_subgraph_cpp:49:3)>
                              *)&adjacency_delete,
                             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(__it_00._M_current + 3));
        _Var22._M_current = __it_00._M_current + 3;
        if (bVar5) goto LAB_00122fb3;
        __it_00._M_current = __it_00._M_current + 4;
        lVar25 = lVar25 + -0x20;
      }
      lVar25 = lVar25 >> 3;
      if (lVar25 == 1) {
LAB_00123628:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_0>
                ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_graph_adjacency_subgraph_cpp:49:3)>
                              *)&adjacency_delete,__it_00);
        _Var22._M_current = __it_00._M_current;
        if (!bVar5) {
          _Var22._M_current = puVar23;
        }
LAB_00122fb3:
        if (_Var22._M_current != puVar23) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"\n");
          local_b8._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0016aca0;
          console_format_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &adjacency_delete,(Disa *)0x0,(Log_Level)&local_b8,psVar13);
          poVar9 = std::operator<<(poVar9,(string *)&adjacency_delete);
          puVar16 = (local_1c8->offset).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          puVar1 = (local_1c8->offset).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar26 = 0;
          if (puVar16 != puVar1) {
            uVar26 = ((long)puVar16 - (long)puVar1 >> 3) - 1;
          }
          std::__cxx11::to_string((string *)(local_138 + 0x10),uVar26);
          std::operator+(&local_1b8,"A global vertex is not in the parsed parent graph range [0, ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_138 + 0x10));
          std::operator+(&local_1f0,&local_1b8,").");
          poVar9 = std::operator<<(poVar9,(string *)&local_1f0);
          std::endl<char,std::char_traits<char>>(poVar9);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)(local_138 + 0x10));
          goto LAB_001236ef;
        }
      }
      else {
        if (lVar25 == 2) {
LAB_0012360e:
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_0>
                  ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_graph_adjacency_subgraph_cpp:49:3)>
                                *)&adjacency_delete,__it_00);
          _Var22._M_current = __it_00._M_current;
          if (!bVar5) {
            __it_00._M_current = __it_00._M_current + 1;
            goto LAB_00123628;
          }
          goto LAB_00122fb3;
        }
        if (lVar25 == 3) {
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_0>
                  ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_graph_adjacency_subgraph_cpp:49:3)>
                                *)&adjacency_delete,__it_00);
          if (!bVar5) {
            __it_00._M_current = __it_00._M_current + 1;
            goto LAB_0012360e;
          }
          goto LAB_00122fb3;
        }
      }
      pAVar4 = local_1c8;
      sVar6 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                        ((hash<Disa::Adjacency_Graph<false>_> *)&adjacency_delete,local_1c8);
      this->hash_parent = sVar6;
      Adjacency_Graph<false>::operator=(local_1d0,pAVar4);
      reserve(this,(long)(i_partition_local_global->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(i_partition_local_global->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3,0);
      puVar16 = (pAVar4->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      puVar1 = (pAVar4->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __n_00 = ((long)puVar16 - (long)puVar1 >> 3) - 1;
      if (puVar16 == puVar1) {
        __n_00 = 0;
      }
      adjacency_delete.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0xffffffffffffffff;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&i_global_local,__n_00,(value_type_conflict *)&adjacency_delete,
                 (allocator_type *)&local_1f0);
      puVar1 = (i_partition_local_global->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar26 = 0;
      for (puVar16 = (i_partition_local_global->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start; puVar16 != puVar1; puVar16 = puVar16 + 1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->i_local_global,puVar16);
        i_global_local.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[*puVar16] = uVar26;
        uVar26 = uVar26 + 1;
      }
      i_vertex = 0;
      local_1f0._M_dataplus._M_p = local_1f0._M_dataplus._M_p & 0xffffffffffffff00;
      local_148 = &i_global_local;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&adjacency_delete,
                 (long)(this->graph).vertex_adjacent_list.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->graph).vertex_adjacent_list.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3,(bool *)&local_1f0,
                 (allocator_type *)&local_1b8);
      __it._M_current =
           (unsigned_long *)
           ((long)(this->graph).vertex_adjacent_list.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->graph).vertex_adjacent_list.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3);
      local_1f0._M_dataplus._M_p = (pointer)0xffffffffffffffff;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&new_indexes,(size_type)__it._M_current,(value_type_conflict *)&local_1f0,
                 (allocator_type *)&local_1b8);
      this_00 = &(this->graph).offset;
      puVar23 = (this->graph).offset.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_140 = 0x800000000000003f;
      local_1f0._M_dataplus._M_p = (pointer)0x0;
      lVar15 = 0;
      while( true ) {
        pAVar4 = local_1d0;
        puVar8 = (this->graph).offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar25 = (long)puVar8 - (long)puVar23;
        if ((lVar25 == 0) ||
           ((pointer)(((long)puVar8 - (long)puVar23 >> 3) - 1U) <= local_1f0._M_dataplus._M_p))
        break;
        pVar27 = Adjacency_Graph<false>::vertex_adjacency_iter(local_1d0,(size_t *)&local_1f0);
        __it = pVar27.second._M_current;
        _Var7 = pVar27.first._M_current;
        puVar16 = (pAVar4->vertex_adjacent_list).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar25 = (long)_Var7._M_current - (long)puVar16;
        uVar12 = lVar25 >> 3;
        auVar2._8_8_ = lVar25 >> 0x3f;
        auVar2._0_8_ = uVar12;
        uVar10 = (uint)uVar12 & 0x3f;
        lVar25 = (long)__it._M_current - (long)puVar16;
        uVar18 = lVar25 >> 3;
        auVar3._8_8_ = lVar25 >> 0x3f;
        auVar3._0_8_ = uVar18;
        puVar23 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar23[(long)local_1f0._M_dataplus._M_p] =
             puVar23[(long)local_1f0._M_dataplus._M_p] - lVar15;
        puVar14 = adjacency_delete.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                  SUB168(auVar2 / SEXT816(0x40),0) +
                  ((ulong)((uVar12 & local_140) < 0x8000000000000001) - 1);
        puVar16 = (local_148->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar24 = 0;
        if (puVar16[(long)local_1f0._M_dataplus._M_p] == 0xffffffffffffffff) {
          puVar20 = puVar14;
          uVar21 = uVar10;
          while ((puVar20 !=
                  adjacency_delete.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                  SUB168(auVar3 / SEXT816(0x40),0) +
                  ((ulong)((uVar18 & local_140) < 0x8000000000000001) - 1) ||
                 (uVar21 != ((uint)uVar18 & 0x3f)))) {
            *puVar14 = *puVar14 | 1L << ((byte)uVar10 & 0x3f);
            bVar5 = uVar21 == 0x3f;
            puVar20 = puVar20 + bVar5;
            uVar21 = uVar21 + 1;
            if (bVar5) {
              uVar21 = uVar24;
            }
            bVar5 = uVar10 == 0x3f;
            uVar10 = uVar10 + 1;
            if (bVar5) {
              uVar10 = uVar24;
            }
            puVar14 = puVar14 + bVar5;
          }
          puVar8 = (unsigned_long *)((long)__it._M_current - (long)_Var7._M_current >> 3);
          __it._M_current = puVar8;
        }
        else {
          sVar6 = i_vertex + 1;
          new_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[(long)local_1f0._M_dataplus._M_p] = i_vertex;
          puVar8 = (unsigned_long *)0x0;
          for (_Var19._M_current = _Var7._M_current; _Var19._M_current != __it._M_current;
              _Var19._M_current = _Var19._M_current + 1) {
            puVar8 = (unsigned_long *)
                     ((long)puVar8 + (ulong)(puVar16[*_Var19._M_current] == 0xffffffffffffffff));
          }
          while (i_vertex = sVar6, _Var7._M_current != __it._M_current) {
            uVar12 = 1L << ((byte)uVar10 & 0x3f);
            if (puVar16[*_Var7._M_current] == 0xffffffffffffffff) {
              uVar12 = uVar12 | *puVar14;
            }
            else {
              uVar12 = ~uVar12 & *puVar14;
            }
            *puVar14 = uVar12;
            _Var7._M_current = _Var7._M_current + 1;
            bVar5 = uVar10 == 0x3f;
            puVar14 = puVar14 + bVar5;
            uVar10 = uVar10 + 1;
            if (bVar5) {
              uVar10 = uVar24;
            }
          }
        }
        lVar15 = lVar15 + (long)puVar8;
        local_1f0._M_dataplus._M_p = local_1f0._M_dataplus._M_p + 1;
      }
      puVar8[-1] = puVar8[-1] - lVar15;
      i_vertex = 0;
      local_1b8._M_dataplus._M_p = (pointer)local_1d0;
      local_1f0.field_2._M_allocated_capacity = (size_type)&local_148;
      local_1f0._M_dataplus._M_p = (pointer)local_1d0;
      local_1f0._M_string_length = (size_type)&i_vertex;
      local_1b8._M_string_length = (size_type)&i_vertex;
      local_1b8.field_2._M_allocated_capacity = local_1f0.field_2._M_allocated_capacity;
      for (lVar15 = lVar25 >> 5; 0 < lVar15; lVar15 = lVar15 + -1) {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#2}>
                ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_2_>
                              *)&local_1f0,__it);
        __first._M_current = puVar23;
        if (bVar5) goto LAB_001233c7;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#2}>
                ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_2_>
                              *)&local_1f0,__it);
        if (bVar5) {
          __first._M_current = puVar23 + 1;
          goto LAB_001233c7;
        }
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#2}>
                ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_2_>
                              *)&local_1f0,__it);
        if (bVar5) {
          __first._M_current = puVar23 + 2;
          goto LAB_001233c7;
        }
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#2}>
                ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_2_>
                              *)&local_1f0,__it);
        if (bVar5) {
          __first._M_current = puVar23 + 3;
          goto LAB_001233c7;
        }
        puVar23 = puVar23 + 4;
        lVar25 = lVar25 + -0x20;
      }
      lVar25 = lVar25 >> 3;
      if (lVar25 == 1) {
LAB_001233a0:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#2}>
                ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_2_>
                              *)&local_1f0,__it);
        __first._M_current = puVar23;
        if (!bVar5) {
          __first._M_current = puVar8;
        }
LAB_001233c7:
        if (__first._M_current != puVar8) {
          puVar23 = __first._M_current;
          while (puVar23 = puVar23 + 1, puVar23 != puVar8) {
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#2}>
                    ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_2_>
                                  *)&local_1b8,__it);
            if (!bVar5) {
              *__first._M_current = *puVar23;
              __first._M_current = __first._M_current + 1;
            }
          }
        }
      }
      else {
        if (lVar25 == 2) {
LAB_0012338e:
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#2}>
                  ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_2_>
                                *)&local_1f0,__it);
          __first._M_current = puVar23;
          if (!bVar5) {
            puVar23 = puVar23 + 1;
            goto LAB_001233a0;
          }
          goto LAB_001233c7;
        }
        __first._M_current = puVar8;
        if (lVar25 == 3) {
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#2}>
                  ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_2_>
                                *)&local_1f0,__it);
          __first._M_current = puVar23;
          if (!bVar5) {
            puVar23 = puVar23 + 1;
            goto LAB_0012338e;
          }
          goto LAB_001233c7;
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                (this_00,__first,
                 (const_iterator)
                 (this->graph).offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      i_vertex = 0;
      puVar16 = (this->graph).vertex_adjacent_list.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar1 = (this->graph).vertex_adjacent_list.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_1f0._M_dataplus._M_p = (pointer)&adjacency_delete;
      lVar15 = (long)puVar1 - (long)puVar16;
      local_1f0._M_string_length = (size_type)&i_vertex;
      local_1b8._M_dataplus._M_p = local_1f0._M_dataplus._M_p;
      local_1b8._M_string_length = (size_type)&i_vertex;
      for (lVar25 = lVar15 >> 5; 0 < lVar25; lVar25 = lVar25 + -1) {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#3}>
                ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_3_>
                              *)&local_1f0,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )__first._M_current);
        if (bVar5) goto LAB_001234ed;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#3}>
                ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_3_>
                              *)&local_1f0,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )__first._M_current);
        if (bVar5) {
          puVar16 = puVar16 + 1;
          goto LAB_001234ed;
        }
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#3}>
                ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_3_>
                              *)&local_1f0,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )__first._M_current);
        if (bVar5) {
          puVar16 = puVar16 + 2;
          goto LAB_001234ed;
        }
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#3}>
                ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_3_>
                              *)&local_1f0,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )__first._M_current);
        if (bVar5) {
          puVar16 = puVar16 + 3;
          goto LAB_001234ed;
        }
        puVar16 = puVar16 + 4;
        lVar15 = lVar15 + -0x20;
      }
      lVar15 = lVar15 >> 3;
      if (lVar15 == 1) {
LAB_001234cb:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#3}>
                ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_3_>
                              *)&local_1f0,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )__first._M_current);
        if (!bVar5) {
          puVar16 = puVar1;
        }
LAB_001234ed:
        __first_00._M_current = puVar16;
        if (puVar16 != puVar1) {
          while (puVar16 = puVar16 + 1, puVar16 != puVar1) {
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#3}>
                    ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_3_>
                                  *)&local_1b8,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )__first._M_current);
            if (!bVar5) {
              *__first_00._M_current = *puVar16;
              __first_00._M_current = __first_00._M_current + 1;
            }
          }
        }
      }
      else {
        if (lVar15 == 2) {
LAB_001234b9:
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#3}>
                  ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_3_>
                                *)&local_1f0,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )__first._M_current);
          if (!bVar5) {
            puVar16 = puVar16 + 1;
            goto LAB_001234cb;
          }
          goto LAB_001234ed;
        }
        __first_00._M_current = puVar1;
        if (lVar15 == 3) {
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::$_1)::{lambda(auto:1)#3}>
                  ::operator()((_Iter_pred<Disa::Adjacency_Graph<false>::erase_if<Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1>(Disa::Adjacency_Subgraph::Adjacency_Subgraph(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long)::__1)::_lambda(auto:1)_3_>
                                *)&local_1f0,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )__first._M_current);
          if (!bVar5) {
            puVar16 = puVar16 + 1;
            goto LAB_001234b9;
          }
          goto LAB_001234ed;
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                (&local_1d0->vertex_adjacent_list,__first_00,
                 (const_iterator)
                 (this->graph).vertex_adjacent_list.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      psVar13 = (source_location *)
                (this->graph).vertex_adjacent_list.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      psVar11 = (source_location *)
                (this->graph).vertex_adjacent_list.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (psVar17 = psVar11; psVar17 != psVar13; psVar17 = psVar17 + 1) {
        psVar17->_M_impl =
             (__impl *)
             new_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[(long)psVar17->_M_impl];
      }
      if ((this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1] == (long)psVar13 - (long)psVar11 >> 3) {
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&new_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&adjacency_delete.super__Bvector_base<std::allocator<bool>_>);
        if (extra_levels != 0) {
          std::
          make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_138);
          update_levels(this,local_1c8,extra_levels,
                        (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                        local_138);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&i_global_local.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  );
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&unique_check.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        return;
      }
      poVar9 = std::operator<<((ostream *)&std::cerr,"\n");
      local_38 = &PTR_s__workspace_llm4binary_github_lic_0016ad48;
      console_format_abi_cxx11_(&local_1f0,(Disa *)0x0,(Log_Level)&local_38,psVar11);
      poVar9 = std::operator<<(poVar9,(string *)&local_1f0);
      std::__cxx11::to_string
                (&local_78,
                 (this->graph).offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]);
      std::operator+(&local_58,
                     "Total offsets no longer match vertex size while reducing to subgraph, ",
                     &local_78);
      std::operator+(&local_b8,&local_58," vs. ");
      std::__cxx11::to_string
                (&local_98,
                 (long)(this->graph).vertex_adjacent_list.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->graph).vertex_adjacent_list.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_138 + 0x10),&local_b8,&local_98);
      std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_138 + 0x10),".");
      poVar9 = std::operator<<(poVar9,(string *)&local_1b8);
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)(local_138 + 0x10));
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      this_01 = &local_1f0;
      goto LAB_001236f4;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,"\n");
    local_1f0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0016ac88;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &adjacency_delete,(Disa *)0x0,(Log_Level)&local_1f0,psVar13);
    poVar9 = std::operator<<(poVar9,(string *)&adjacency_delete);
    poVar9 = std::operator<<(poVar9,"Partition size is bigger than graph vertex size.");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  else {
    poVar9 = std::operator<<((ostream *)&std::cerr,"\n");
    local_1f0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0016ac70;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &adjacency_delete,(Disa *)0x0,(Log_Level)&local_1f0,psVar11);
    poVar9 = std::operator<<(poVar9,(string *)&adjacency_delete);
    poVar9 = std::operator<<(poVar9,"Partition vertices are not unique.");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
LAB_001236ef:
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&adjacency_delete;
LAB_001236f4:
  std::__cxx11::string::~string((string *)this_01);
  exit(1);
}

Assistant:

Adjacency_Subgraph::Adjacency_Subgraph(const Adjacency_Graph<false>& parent_graph,
                                       const std::vector<std::size_t>& i_partition_local_global,
                                       const std::size_t extra_levels) {
#ifdef DISA_DEBUG
  std::vector<std::size_t> unique_check;
  std::unique_copy(i_partition_local_global.begin(), i_partition_local_global.end(), std::back_inserter(unique_check));
  ASSERT(unique_check.size() == i_partition_local_global.size(), "Partition vertices are not unique.");
  ASSERT(i_partition_local_global.size() <= parent_graph.size_vertex(),
         "Partition size is bigger than graph vertex size.");
  ASSERT(
  !std::any_of(i_partition_local_global.begin(), i_partition_local_global.end(),
               [&](const std::size_t i_global) { return i_global >= parent_graph.size_vertex(); }),
  "A global vertex is not in the parsed parent graph range [0, " + std::to_string(parent_graph.size_vertex()) + ").");
#endif

  hash_parent = std::hash<Adjacency_Graph<false>>{}(parent_graph);
  graph = parent_graph;
  reserve(i_partition_local_global.size());

  // Copy the contents of the graph into the sub-graph and set up axillary containers.
  std::size_t i_local_vertex = 0;
  std::vector<std::size_t> i_global_local(parent_graph.size_vertex(), std::numeric_limits<std::size_t>::max());
  FOR_EACH(i_global_vertex, i_partition_local_global) {
    i_local_global.push_back(i_global_vertex);
    i_global_local[i_global_vertex] = i_local_vertex;
    ++i_local_vertex;
  }

  // Remove vertices not in this subgraph.
  auto not_in_subgraph = [&](const std::size_t& vertex) {
    return i_global_local[vertex] == std::numeric_limits<std::size_t>::max();
  };
  graph.erase_if(not_in_subgraph);

  // Add back additional levels as needed.
  if(extra_levels != 0)
    update_levels(parent_graph, extra_levels, std::make_shared<std::vector<std::size_t>>(i_global_local));
}